

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

yoml_t * resolve_tag(char *tag,yoml_t *node,void *cb_arg)

{
  int iVar1;
  resolve_tag_arg_t *arg;
  void *cb_arg_local;
  yoml_t *node_local;
  char *tag_local;
  
  iVar1 = strcmp(tag,"!file");
  if (iVar1 == 0) {
    tag_local = (char *)resolve_file_tag(node,(resolve_tag_arg_t *)cb_arg);
  }
  else {
    node->_refcnt = node->_refcnt + 1;
    tag_local = (char *)node;
  }
  return (yoml_t *)tag_local;
}

Assistant:

static yoml_t *resolve_tag(const char *tag, yoml_t *node, void *cb_arg)
{
    resolve_tag_arg_t *arg = (resolve_tag_arg_t *)cb_arg;

    if (strcmp(tag, "!file") == 0) {
        return resolve_file_tag(node, arg);
    }

    /* otherwise, return the node itself */
    ++node->_refcnt;
    return node;
}